

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddPubkeyHashSignByHandle
              (void *handle,void *create_handle,char *txid,uint32_t vout,int hash_type,char *pubkey,
              char *signature,bool use_der_encode,int sighash_type,bool sighash_anyone_can_pay)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  uint32_t in_ECX;
  string *in_RDX;
  SignParameter *in_RSI;
  SignParameter *in_R9;
  ConfidentialTransactionContext *in_stack_00000008;
  byte in_stack_00000010;
  uint8_t in_stack_00000018;
  byte in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  AddressType addr_type;
  OutPoint outpoint;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  SignParameter *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  CfdError error_code;
  SignParameter *in_stack_fffffffffffffac0;
  AddressType AVar5;
  allocator *paVar4;
  SigHashType *in_stack_fffffffffffffac8;
  Pubkey *pubkey_00;
  SignParameter *in_stack_fffffffffffffad0;
  OutPoint *in_stack_fffffffffffffad8;
  OutPoint *outpoint_00;
  ConfidentialTransactionContext *in_stack_fffffffffffffae0;
  bool *in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffb04;
  undefined7 in_stack_fffffffffffffb38;
  SignParameter *in_stack_fffffffffffffb40;
  SigHashType *sighash_type_00;
  undefined1 der_encode;
  string *in_stack_fffffffffffffba8;
  void *in_stack_fffffffffffffbb0;
  Pubkey local_430;
  undefined8 local_418;
  OutPoint local_409;
  Pubkey *local_3d0;
  SigHashType local_3c8;
  allocator local_3b9;
  string local_3b8 [156];
  SigHashType local_31c [11];
  allocator local_291;
  string local_290;
  ByteData local_270;
  SigHashType local_254 [11];
  AddressType local_1d0;
  allocator local_1c9;
  string local_1c8;
  Txid local_1a8;
  OutPoint local_188;
  undefined1 local_15a;
  allocator local_159;
  string local_158 [37];
  byte local_133;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  SignParameter *local_78;
  SigHashType local_69 [4];
  byte local_32;
  byte local_31;
  SignParameter *local_30;
  uint32_t local_24;
  string *local_20;
  SignParameter *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  local_31 = in_stack_00000010 & 1;
  local_32 = in_stack_00000020 & 1;
  local_30 = in_R9;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  der_encode = (undefined1)(in_ECX >> 0x18);
  sighash_type_00 = local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_69[0].kSigHashRangeproof,"TransactionData",
             (allocator *)sighash_type_00);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::__cxx11::string::~string((string *)&local_69[0].kSigHashRangeproof);
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  local_78 = local_18;
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x55a;
    local_90.funcname = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>(&local_90,"txid is null or empty.");
    local_b2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. txid is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_b2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_30);
  if (bVar1) {
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x560;
    local_d0.funcname = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>(&local_d0,"pubkey is null or empty.");
    local_f2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Failed to parameter. pubkey is null or empty.",&local_f1)
    ;
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_f2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar2 = cfd::capi::IsEmptyString((char *)in_stack_00000008);
  if ((bool)uVar2) {
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x566;
    local_110.funcname = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>(&local_110,"signature is null or empty.");
    local_132 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,"Failed to parameter. signature is null or empty.",&local_131);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_132 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_133 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffb04,in_stack_fffffffffffffaf8);
  if (*(long *)&local_78->data_type_ == 0) {
    local_15a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"Invalid handle state. tx is null",&local_159);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_15a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,(char *)local_20,&local_1c9);
  cfd::core::Txid::Txid(&local_1a8,&local_1c8);
  cfd::core::OutPoint::OutPoint(&local_188,&local_1a8,local_24);
  cfd::core::Txid::~Txid((Txid *)0x612b6b);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_1d0 = cfd::capi::ConvertHashToAddressType(in_stack_fffffffffffffb04);
  cfd::SignParameter::SignParameter(in_stack_fffffffffffffac0);
  AVar5 = (AddressType)((ulong)in_stack_fffffffffffffac0 >> 0x20);
  if ((local_31 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,(char *)in_stack_00000008,&local_3b9);
    cfd::core::SigHashType::SigHashType(&local_3c8,kSigHashAll,false,false);
    cfd::SignParameter::SignParameter(in_RSI,in_RDX,(bool)der_encode,sighash_type_00);
    cfd::SignParameter::operator=
              (in_stack_fffffffffffffb40,(SignParameter *)CONCAT17(uVar2,in_stack_fffffffffffffb38))
    ;
    cfd::SignParameter::~SignParameter(in_stack_fffffffffffffaa0);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    in_stack_fffffffffffffae0 = in_stack_00000008;
  }
  else {
    cfd::core::SigHashType::Create(local_254,in_stack_00000018,(bool)(local_32 & 1),false);
    paVar4 = &local_291;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,(char *)in_stack_00000008,paVar4);
    cfd::core::ByteData::ByteData(&local_270,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    cfd::core::SigHashType::SigHashType(local_31c,local_254);
    cfd::SignParameter::SignParameter
              ((SignParameter *)in_stack_fffffffffffffae0,(ByteData *)in_stack_fffffffffffffad8,
               SUB81((ulong)in_stack_fffffffffffffad0 >> 0x38,0),in_stack_fffffffffffffac8);
    cfd::SignParameter::operator=
              (in_stack_fffffffffffffb40,(SignParameter *)CONCAT17(uVar2,in_stack_fffffffffffffb38))
    ;
    cfd::SignParameter::~SignParameter(in_stack_fffffffffffffaa0);
    cfd::core::ByteData::~ByteData((ByteData *)0x612cb8);
  }
  if ((local_133 & 1) == 0) {
    local_418 = *(undefined8 *)&local_78->data_type_;
    paVar4 = (allocator *)&stack0xfffffffffffffbaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffbb0,(char *)local_30,paVar4);
    AVar5 = (AddressType)((ulong)paVar4 >> 0x20);
    cfd::core::Pubkey::Pubkey(&local_430,(string *)&stack0xfffffffffffffbb0);
    cfd::ConfidentialTransactionContext::AddPubkeyHashSign
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
               (Pubkey *)in_stack_fffffffffffffac8,AVar5);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x6130f5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbaf);
  }
  else {
    pubkey_00 = *(Pubkey **)&local_78->data_type_;
    outpoint_00 = &local_409;
    local_3d0 = pubkey_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)((long)&local_409.txid_._vptr_Txid + 1),(char *)local_30,
               (allocator *)outpoint_00);
    cfd::core::Pubkey::Pubkey
              ((Pubkey *)((long)&local_409.vout_ + 1),
               (string *)((long)&local_409.txid_._vptr_Txid + 1));
    cfd::TransactionContext::AddPubkeyHashSign
              ((TransactionContext *)in_stack_fffffffffffffae0,outpoint_00,local_30,pubkey_00,AVar5)
    ;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x612fc1);
    std::__cxx11::string::~string((string *)((long)&local_409.txid_._vptr_Txid + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
  }
  local_4 = 0;
  cfd::SignParameter::~SignParameter(in_stack_fffffffffffffaa0);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x61319f);
  return local_4;
}

Assistant:

int CfdAddPubkeyHashSignByHandle(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int hash_type, const char* pubkey, const char* signature,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    }
    OutPoint outpoint(Txid(txid), vout);

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(signature));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(signature));
    }

    if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}